

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O3

uint __thiscall Clock::GetTimeDelta(Clock *this)

{
  uint uVar1;
  uint uVar2;
  timespec gettime;
  timespec local_28;
  
  clock_gettime(1,&local_28);
  uVar2 = (int)local_28.tv_sec * 1000 +
          ((int)(SUB168(SEXT816(0x431bde82d7b634db) * SEXT816(local_28.tv_nsec),8) >> 0x12) -
          (SUB164(SEXT816(0x431bde82d7b634db) * SEXT816(local_28.tv_nsec),0xc) >> 0x1f));
  uVar1 = uVar2 - this->last;
  if ((int)uVar1 < 0) {
    Console::Wrn("A time delta of %i ms was detected and ignored.",(ulong)uVar1);
    uVar1 = 0;
  }
  if (this->max_delta < (int)uVar1) {
    Console::Wrn("A time delta of %i ms was detected and ignored.",(ulong)uVar1);
    uVar1 = this->max_delta;
  }
  this->last = uVar2;
  return uVar1;
}

Assistant:

unsigned int Clock::GetTimeDelta()
{
	unsigned int ticks = clock_ticks();
	unsigned int delta = ticks - last;

	if ((int)delta < 0)
	{
		Console::Wrn("A time delta of %i ms was detected and ignored.", delta);
		delta = 0;
	}

	if ((int)delta > max_delta)
	{
		Console::Wrn("A time delta of %i ms was detected and ignored.", delta);
		delta = max_delta;
	}

	last = ticks;

	return delta;
}